

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O0

void __thiscall duckdb::StructColumnReader::Skip(StructColumnReader *this,idx_t num_values)

{
  bool bVar1;
  pointer pCVar2;
  undefined8 in_RSI;
  long in_RDI;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *child;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
  *__range1;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
  local_20;
  long local_18;
  undefined8 local_10;
  
  local_18 = in_RDI + 0x1f0;
  local_10 = in_RSI;
  local_20._M_current =
       (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
       std::
       vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
  ::end(in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffffd0,
                            (__normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
                             *)in_stack_ffffffffffffffc8), bVar1) {
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
            ::operator*(&local_20);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                        *)0x85ac6a);
    if (bVar1) {
      pCVar2 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                           *)in_stack_ffffffffffffffd0);
      (*pCVar2->_vptr_ColumnReader[6])(pCVar2,local_10);
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void StructColumnReader::Skip(idx_t num_values) {
	for (auto &child : child_readers) {
		if (!child) {
			continue;
		}
		child->Skip(num_values);
	}
}